

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix
          (TPZFMatrix<long_double> *this,void **vtt,int64_t rows,int64_t cols,longdouble *val)

{
  longdouble lVar1;
  longdouble *plVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  TPZMatrix<long_double>::TPZMatrix(&this->super_TPZMatrix<long_double>,vtt + 1,rows,cols);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  this->fElem = (longdouble *)0x0;
  this->fGiven = (longdouble *)0x0;
  this->fSize = 0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016491a8;
  (this->fWork).fNAlloc = 0;
  (this->fWork).fStore = (longdouble *)0x0;
  (this->fWork).fNElements = 0;
  uVar4 = cols * rows;
  if (uVar4 != 0) {
    plVar2 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 * 0x10);
    this->fElem = plVar2;
    lVar1 = *val;
    uVar3 = 0;
    if (0 < (long)uVar4) {
      uVar3 = uVar4;
    }
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      *plVar2 = lVar1;
      plVar2 = plVar2 + 1;
    }
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,const TVar & val )
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>( rows, cols ), 
 fElem(0), fGiven(0), fSize(0) {
    int64_t size = rows * cols;
    if(!size) return;
    fElem=new TVar[size];
#ifdef PZDEBUG
    if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    for(int64_t i=0;i<size;i++) fElem[i] = val;
}